

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.cpp
# Opt level: O1

long __thiscall internalJSONNode::operator_cast_to_long(internalJSONNode *this)

{
  double dVar1;
  byte bVar2;
  long *plVar3;
  internalJSONNode *piVar4;
  internalJSONNode *piVar5;
  internalJSONNode *piVar6;
  ulong uVar7;
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  
  piVar4 = this;
  Fetch(this);
  bVar2 = this->_type;
  uVar7 = (ulong)bVar2;
  if (bVar2 != 0) {
    if (bVar2 == 1) {
      piVar4 = (internalJSONNode *)(this->_string)._M_dataplus._M_p;
      dVar1 = atof((char *)piVar4);
      (this->_value)._number = dVar1;
    }
    else if (bVar2 == 3) {
      return (ulong)(this->_value)._bool;
    }
    if (jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_long(piVar4);
    }
    piVar4 = (internalJSONNode *)(local_60 + 0x10);
    local_60._0_8_ = piVar4;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single,
               DAT_00126760 + jsonSingletonERROR_UNDEFINED::getValue[abi:cxx11]()::single);
    std::__cxx11::string::append(local_60);
    JSONDebug::_JSON_ASSERT(bVar2 == 2,(json_string *)local_60);
    piVar5 = (internalJSONNode *)local_60._0_8_;
    if ((internalJSONNode *)local_60._0_8_ != piVar4) {
      operator_delete((void *)local_60._0_8_);
    }
    dVar1 = (this->_value)._number;
    if (jsonSingletonERROR_LOWER_RANGE::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_long(piVar5);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &this->_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   jsonSingletonERROR_LOWER_RANGE::getValue[abi:cxx11]()::single);
    plVar3 = (long *)std::__cxx11::string::append(local_40);
    piVar5 = (internalJSONNode *)(plVar3 + 2);
    if ((internalJSONNode *)*plVar3 == piVar5) {
      local_60._16_8_ = *(undefined8 *)piVar5;
      local_60._24_8_ = plVar3[3];
      local_60._0_8_ = piVar4;
    }
    else {
      local_60._16_8_ = *(undefined8 *)piVar5;
      local_60._0_8_ = (internalJSONNode *)*plVar3;
    }
    local_60._8_8_ = plVar3[1];
    *plVar3 = (long)piVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    JSONDebug::_JSON_ASSERT(-9.223372036854776e+18 < dVar1,(json_string *)local_60);
    if ((internalJSONNode *)local_60._0_8_ != piVar4) {
      operator_delete((void *)local_60._0_8_);
    }
    piVar5 = (internalJSONNode *)(local_40 + 0x10);
    piVar6 = (internalJSONNode *)local_40._0_8_;
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    dVar1 = (this->_value)._number;
    if (jsonSingletonERROR_UPPER_RANGE::getValue[abi:cxx11]()::single == '\0') {
      operator_cast_to_long(piVar6);
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &this->_string,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   jsonSingletonERROR_UPPER_RANGE::getValue[abi:cxx11]()::single);
    plVar3 = (long *)std::__cxx11::string::append(local_40);
    piVar6 = (internalJSONNode *)(plVar3 + 2);
    if ((internalJSONNode *)*plVar3 == piVar6) {
      local_60._16_8_ = *(undefined8 *)piVar6;
      local_60._24_8_ = plVar3[3];
      local_60._0_8_ = piVar4;
    }
    else {
      local_60._16_8_ = *(undefined8 *)piVar6;
      local_60._0_8_ = (internalJSONNode *)*plVar3;
    }
    local_60._8_8_ = plVar3[1];
    *plVar3 = (long)piVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    JSONDebug::_JSON_ASSERT(dVar1 < 9.223372036854776e+18,(json_string *)local_60);
    if ((internalJSONNode *)local_60._0_8_ != piVar4) {
      operator_delete((void *)local_60._0_8_);
    }
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    dVar1 = (this->_value)._number;
    local_40._0_8_ = piVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"(long) will truncate ","");
    plVar3 = (long *)std::__cxx11::string::_M_append
                               (local_40,(ulong)(this->_string)._M_dataplus._M_p);
    piVar6 = (internalJSONNode *)(plVar3 + 2);
    if ((internalJSONNode *)*plVar3 == piVar6) {
      local_60._16_8_ = *(undefined8 *)piVar6;
      local_60._24_8_ = plVar3[3];
      local_60._0_8_ = piVar4;
    }
    else {
      local_60._16_8_ = *(undefined8 *)piVar6;
      local_60._0_8_ = (internalJSONNode *)*plVar3;
    }
    local_60._8_8_ = plVar3[1];
    *plVar3 = (long)piVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    JSONDebug::_JSON_ASSERT((bool)(-(dVar1 == (double)(long)dVar1) & 1),(json_string *)local_60);
    if ((internalJSONNode *)local_60._0_8_ != piVar4) {
      operator_delete((void *)local_60._0_8_);
    }
    if ((internalJSONNode *)local_40._0_8_ != piVar5) {
      operator_delete((void *)local_40._0_8_);
    }
    uVar7 = (ulong)(this->_value)._number;
  }
  return uVar7;
}

Assistant:

internalJSONNode::operator long long() const json_nothrow
    #endif /*<- */
    {
	   Fetch();
	   #ifdef JSON_CASTABLE /*-> JSON_CASTABLE */
		  switch(type()){
			 case JSON_NULL:
				return 0;
			 case JSON_BOOL:
				return _value._bool ? 1 : 0;
			 case JSON_STRING:
				FetchNumber();
		  }
	   #endif /*<- */
	   #ifdef JSON_ISO_STRICT /*-> JSON_ISO_STRICT */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long)"));
		  JSON_ASSERT(_value._number > LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number < LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long"));
		  JSON_ASSERT(_value._number == (json_number)((long)_value._number), json_string(JSON_TEXT("(long) will truncate ")) + _string);
		  return (long)_value._number;
	   #else /*<- else */
		  JSON_ASSERT(type() == JSON_NUMBER, json_global(ERROR_UNDEFINED) + JSON_TEXT("(long long)"));
		  #ifdef LONG_LONG_MAX			 
			 JSON_ASSERT(_value._number < LONG_LONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number < LLONG_MAX, _string + json_global(ERROR_UPPER_RANGE) + JSON_TEXT("long long"));
		  #endif
		  #ifdef LONG_LONG_MIN
			 JSON_ASSERT(_value._number > LONG_LONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #elif defined(LLONG_MAX)
			 JSON_ASSERT(_value._number > LLONG_MIN, _string + json_global(ERROR_LOWER_RANGE) + JSON_TEXT("long long"));
		  #endif

		  JSON_ASSERT(_value._number == (json_number)((long long)_value._number), json_string(JSON_TEXT("(long long) will truncate ")) + _string);
		  return (long long)_value._number;
	   #endif /*<- */
    }